

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mainInit.c
# Opt level: O1

void Abc_FrameInit(Abc_Frame_t *pAbc)

{
  Abc_FrameInitializer_t *pAVar1;
  
  Cmd_Init(pAbc);
  Cmd_CommandExecute(pAbc,"set checkread");
  Io_Init(pAbc);
  Abc_Init(pAbc);
  If_Init(pAbc);
  Map_Init(pAbc);
  Mio_Init(pAbc);
  Super_Init(pAbc);
  Libs_Init(pAbc);
  Load_Init(pAbc);
  Scl_Init(pAbc);
  Wlc_Init(pAbc);
  Bac_Init(pAbc);
  Cba_Init(pAbc);
  Pla_Init(pAbc);
  Sim_Init(pAbc);
  Test_Init(pAbc);
  Glucose_Init(pAbc);
  for (pAVar1 = s_InitializerStart; pAVar1 != (Abc_FrameInitializer_t *)0x0; pAVar1 = pAVar1->next)
  {
    if (pAVar1->init != (Abc_Frame_Initialization_Func)0x0) {
      (*pAVar1->init)(pAbc);
    }
  }
  return;
}

Assistant:

void Abc_FrameInit( Abc_Frame_t * pAbc )
{
    Abc_FrameInitializer_t* p;
    Cmd_Init( pAbc );
    Cmd_CommandExecute( pAbc, "set checkread" ); 
    Io_Init( pAbc );
    Abc_Init( pAbc );
    If_Init( pAbc );
    Map_Init( pAbc );
    Mio_Init( pAbc );
    Super_Init( pAbc );
    Libs_Init( pAbc );
    Load_Init( pAbc );
    Scl_Init( pAbc );
    Wlc_Init( pAbc );
    Bac_Init( pAbc );
    Cba_Init( pAbc );
    Pla_Init( pAbc );
    Sim_Init( pAbc );
    Test_Init( pAbc );
    Glucose_Init( pAbc );
    for( p = s_InitializerStart ; p ; p = p->next )
        if(p->init)
            p->init(pAbc);
}